

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

Type __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_(void *this,Type type)

{
  const_iterator cVar1;
  Type TVar2;
  Type TVar3;
  key_type *pkVar4;
  Type *t;
  Type local_48;
  Type type_local;
  Tuple tuple;
  
  local_48.id = type.id;
  if ((type.id & 1) == 0 && 6 < type.id) {
    type_local.id = (uintptr_t)wasm::Type::getHeapType(&local_48);
    cVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(*(_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     **)((long)this + 0x130),(key_type *)&type_local);
    pkVar4 = (key_type *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                    ._M_cur + 0x10);
    if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
        _M_cur == (__node_type *)0x0) {
      pkVar4 = (key_type *)&type_local;
    }
    TVar2 = wasm::Type::with(&local_48,pkVar4->id);
  }
  else {
    TVar2.id = type.id;
    if ((type.id & 1) != 0 && 6 < type.id) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&type_local,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(type.id & 0xfffffffffffffffe));
      for (TVar2 = type_local;
          (pointer)TVar2.id !=
          tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start; TVar2.id = TVar2.id + 8) {
        TVar3 = Type_(this,((pointer)TVar2.id)->id);
        ((pointer)TVar2.id)->id = TVar3.id;
      }
      wasm::Type::Type((Type *)&tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Tuple *)&type_local);
      TVar2.id = (uintptr_t)
                 tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      if (type_local.id != 0) {
        operator_delete((void *)type_local.id,
                        (long)tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - type_local.id);
        TVar2.id = (uintptr_t)
                   tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
  tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)TVar2.id;
  return (Type)(uintptr_t)
               tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
}

Assistant:

Type getNew(Type type) {
      if (type.isRef()) {
        return type.with(getNew(type.getHeapType()));
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }